

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitStream.h
# Opt level: O3

void __thiscall BitStreamWriter::flushBits(BitStreamWriter *this)

{
  uint32_t uVar1;
  
  if (this->m_bitWrited != 0) {
    this->m_curVal = this->m_curVal << (0x20U - (char)this->m_bitWrited & 0x1f);
  }
  uVar1 = my_ntohl(*(this->super_BitStream).m_buffer);
  uVar1 = my_ntohl(uVar1 & BitStream::m_masks[0x20 - this->m_bitWrited] | this->m_curVal);
  *(this->super_BitStream).m_buffer = uVar1;
  return;
}

Assistant:

void flushBits()
    {
        if (m_bitWrited != 0)
        {
            m_curVal <<= (INT_BIT - m_bitWrited);
        }
        unsigned prevVal = my_ntohl(*m_buffer);
        prevVal &= m_masks[INT_BIT - m_bitWrited];
        prevVal |= m_curVal;
        *m_buffer = my_htonl(prevVal);
    }